

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::Status::ToStringSlow_abi_cxx11_
          (string *__return_storage_ptr__,Status *this,uintptr_t rep,StatusToStringMode mode)

{
  bool bVar1;
  StatusCode SVar2;
  Nonnull<const_status_internal::StatusRep_*> this_00;
  StatusCode code;
  AlphaNum local_b0;
  string local_70;
  AlphaNum local_50;
  StatusToStringMode local_1c;
  Status *pSStack_18;
  StatusToStringMode mode_local;
  uintptr_t rep_local;
  
  local_1c = (StatusToStringMode)rep;
  pSStack_18 = this;
  rep_local = (uintptr_t)__return_storage_ptr__;
  bVar1 = IsInlined((uintptr_t)this);
  if (bVar1) {
    SVar2 = InlinedRepToCode((uintptr_t)pSStack_18);
    StatusCodeToString_abi_cxx11_(&local_70,(lts_20240722 *)(ulong)SVar2,code);
    AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
    AlphaNum::AlphaNum(&local_b0,": ");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    this_00 = RepToPointer((uintptr_t)pSStack_18);
    status_internal::StatusRep::ToString_abi_cxx11_(__return_storage_ptr__,this_00,local_1c);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToStringSlow(uintptr_t rep, StatusToStringMode mode) {
  if (IsInlined(rep)) {
    return absl::StrCat(absl::StatusCodeToString(InlinedRepToCode(rep)), ": ");
  }
  return RepToPointer(rep)->ToString(mode);
}